

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall cmCPackRPMGenerator::InitializeInternal(cmCPackRPMGenerator *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_1f1;
  string local_1f0;
  char local_1ca [2];
  char *local_1c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  allocator local_1b2;
  allocator local_1b1;
  string local_1b0;
  string local_190 [8];
  string packageName_1;
  string local_168;
  allocator local_141;
  string local_140;
  char local_11a [2];
  char *local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  allocator local_102;
  allocator local_101;
  string local_100;
  string local_e0 [8];
  string packageName;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  cmCPackRPMGenerator *local_10;
  cmCPackRPMGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CPACK_PACKAGING_INSTALL_PREFIX",&local_31);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"/usr");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CPACK_SET_DESTDIR",&local_69);
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
  bVar1 = cmSystemTools::IsOff(pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CPACK_SET_DESTDIR",&local_91);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_90,"I_ON");
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"CPACK_PACKAGE_NAME",
             (allocator *)(packageName.field_2._M_local_buf + 0xf));
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"CPACK_PACKAGE_NAME",&local_101);
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,pcVar3,&local_102);
    std::allocator<char>::~allocator((allocator<char> *)&local_102);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    local_110._M_current = (char *)std::__cxx11::string::begin();
    local_118 = (char *)std::__cxx11::string::end();
    local_11a[1] = 0x20;
    local_11a[0] = '-';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_110,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_118,local_11a + 1,local_11a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"CPACK_PACKAGE_NAME",&local_141);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_140,pcVar3);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string(local_e0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"CPACK_PACKAGE_FILE_NAME",
             (allocator *)(packageName_1.field_2._M_local_buf + 0xf));
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)(packageName_1.field_2._M_local_buf + 0xf));
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"CPACK_PACKAGE_FILE_NAME",&local_1b1);
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,pcVar3,&local_1b2);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b2);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    local_1c0._M_current = (char *)std::__cxx11::string::begin();
    local_1c8 = (char *)std::__cxx11::string::end();
    local_1ca[1] = 0x20;
    local_1ca[0] = '-';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_1c0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_1c8,local_1ca + 1,local_1ca);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,"CPACK_PACKAGE_FILE_NAME",&local_1f1);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1f0,pcVar3);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    std::__cxx11::string::~string(local_190);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackRPMGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (cmSystemTools::IsOff(this->GetOption("CPACK_SET_DESTDIR"))) {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
  }
  /* Replace space in CPACK_PACKAGE_NAME in order to avoid
   * rpmbuild scream on unwanted space in filename issue
   * Moreover RPM file do not usually embed space in filename
   */
  if (this->GetOption("CPACK_PACKAGE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_NAME", packageName.c_str());
  }
  /* same for CPACK_PACKAGE_FILE_NAME */
  if (this->GetOption("CPACK_PACKAGE_FILE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_FILE_NAME", packageName.c_str());
  }
  return this->Superclass::InitializeInternal();
}